

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dymon.cpp
# Opt level: O2

void log_status(int i,uint8_t *status,uint32_t count)

{
  ostream *poVar1;
  uint32_t j;
  ulong uVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Status");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"): ");
  for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"0123456789ABCDEF"[status[uVar2] >> 4]);
    poVar1 = std::operator<<(poVar1,"0123456789ABCDEF"[status[uVar2] & 0xf]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

static void log_status(int i, const uint8_t * status, uint32_t count)
{
   static const char * const hex = "0123456789ABCDEF";
   std::cout << "Status" << i << " (" << count << "): ";
   for (uint32_t j = 0; j < count; ++j)
   {
      std::cout << hex[(status[j] >> 4)] << hex[(status[j] & 0xF)] << " ";
   }
   std::cout << std::endl;
}